

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall
tcu::ThreadUtil::Object::Object(Object *this,char *type,SharedPtr<tcu::ThreadUtil::Event> *e)

{
  SharedPtr<tcu::ThreadUtil::Event> *e_local;
  char *type_local;
  Object *this_local;
  
  this->_vptr_Object = (_func_int **)&PTR__Object_032dcc68;
  this->m_type = type;
  de::SharedPtr<tcu::ThreadUtil::Event>::SharedPtr(&this->m_modify,e);
  std::
  vector<de::SharedPtr<tcu::ThreadUtil::Event>,_std::allocator<de::SharedPtr<tcu::ThreadUtil::Event>_>_>
  ::vector(&this->m_reads);
  return;
}

Assistant:

Object::Object (const char* type, SharedPtr<Event> e)
	: m_type	(type)
	, m_modify	(e)
{
}